

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O0

void __thiscall DistanceGraph::disconnect_node(DistanceGraph *this,sgNodeID_t node)

{
  bool bVar1;
  reference pLVar2;
  __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> *in_RDI;
  sgNodeID_t unaff_retaddr;
  DistanceGraph *in_stack_00000008;
  Link bwl;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Link,_std::allocator<Link>_> *__range1_1;
  Link fwl;
  iterator __end1;
  iterator __begin1;
  vector<Link,_std::allocator<Link>_> *__range1;
  vector<Link,_std::allocator<Link>_> *in_stack_ffffffffffffff18;
  DistanceGraph *in_stack_ffffffffffffff28;
  vector<Link,_std::allocator<Link>_> *in_stack_ffffffffffffff30;
  __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> local_a0 [4];
  sgNodeID_t in_stack_ffffffffffffff80;
  DistanceGraph *in_stack_ffffffffffffff88;
  __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> local_38;
  undefined1 local_30 [24];
  undefined1 *local_18;
  __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> *dest;
  
  dest = in_RDI;
  get_fw_links(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  local_18 = local_30;
  local_38._M_current =
       (Link *)std::vector<Link,_std::allocator<Link>_>::begin(in_stack_ffffffffffffff18);
  std::vector<Link,_std::allocator<Link>_>::end(in_stack_ffffffffffffff18);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                               *)in_stack_ffffffffffffff18);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::operator*
              (&local_38);
    remove_link(in_stack_00000008,unaff_retaddr,(sgNodeID_t)dest);
    __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::operator++
              (&local_38);
  }
  std::vector<Link,_std::allocator<Link>_>::~vector(in_stack_ffffffffffffff30);
  get_bw_links(in_stack_ffffffffffffff28,(sgNodeID_t)in_RDI);
  local_a0[0]._M_current =
       (Link *)std::vector<Link,_std::allocator<Link>_>::begin(in_stack_ffffffffffffff18);
  std::vector<Link,_std::allocator<Link>_>::end(in_stack_ffffffffffffff18);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                               *)in_stack_ffffffffffffff18);
    if (!bVar1) break;
    pLVar2 = __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
             operator*(local_a0);
    in_stack_ffffffffffffff30 = (vector<Link,_std::allocator<Link>_> *)pLVar2->dest;
    remove_link(in_stack_00000008,unaff_retaddr,(sgNodeID_t)dest);
    __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::operator++
              (local_a0);
  }
  std::vector<Link,_std::allocator<Link>_>::~vector(in_stack_ffffffffffffff30);
  return;
}

Assistant:

void DistanceGraph::disconnect_node(sgNodeID_t node) {
    for (auto fwl:get_fw_links(node)) remove_link(fwl.source,fwl.dest);
    for (auto bwl:get_bw_links(node)) remove_link(bwl.source,bwl.dest);
}